

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O0

void InitializeLogger(string *info_log_filename,string *warn_log_filename,string *erro_log_filename)

{
  byte bVar1;
  undefined8 uVar2;
  ostream *poVar3;
  string *in_RDX;
  string *in_RSI;
  string *in_RDI;
  bool bVar4;
  bool bo;
  bool local_19;
  
  uVar2 = std::__cxx11::string::c_str();
  std::ofstream::open(Logger::info_log_file_,uVar2,0x10);
  uVar2 = std::__cxx11::string::c_str();
  std::ofstream::open(Logger::warn_log_file_,uVar2,0x10);
  uVar2 = std::__cxx11::string::c_str();
  std::ofstream::open(Logger::erro_log_file_,uVar2,0x10);
  bVar1 = std::ofstream::is_open();
  bVar4 = (bVar1 & 1) == 0;
  if (bVar4) {
    poVar3 = std::operator<<((ostream *)&std::cout,"Cannot create file: ");
    poVar3 = std::operator<<(poVar3,in_RDI);
    poVar3 = std::operator<<(poVar3,". ");
    poVar3 = std::operator<<(poVar3,"Please check that wether you need to ");
    std::operator<<(poVar3,"create a new directory. \n");
  }
  bVar1 = std::ofstream::is_open();
  local_19 = (bVar1 & 1) == 0;
  if (local_19) {
    poVar3 = std::operator<<((ostream *)&std::cout,"Cannot create file: ");
    poVar3 = std::operator<<(poVar3,in_RSI);
    poVar3 = std::operator<<(poVar3,". ");
    poVar3 = std::operator<<(poVar3,"Please check that wether you need to ");
    std::operator<<(poVar3,"create a new directory. \n");
  }
  local_19 = local_19 || bVar4;
  bVar1 = std::ofstream::is_open();
  if ((bVar1 & 1) == 0) {
    poVar3 = std::operator<<((ostream *)&std::cout,"Cannot create file:  ");
    poVar3 = std::operator<<(poVar3,in_RDX);
    poVar3 = std::operator<<(poVar3,". ");
    poVar3 = std::operator<<(poVar3,"Please check that wether you need to ");
    std::operator<<(poVar3,"create a new directory. \n");
    local_19 = true;
  }
  if (local_19) {
    exit(0);
  }
  return;
}

Assistant:

void InitializeLogger(const std::string& info_log_filename,
                      const std::string& warn_log_filename,
                      const std::string& erro_log_filename) {
  Logger::info_log_file_.open(info_log_filename.c_str());
  Logger::warn_log_file_.open(warn_log_filename.c_str());
  Logger::erro_log_file_.open(erro_log_filename.c_str());
  // check if the file has been open
  bool bo = false;
  if (Logger::info_log_file_.is_open() == 0) {
    std::cout << "Cannot create file: " << info_log_filename << ". "
              << "Please check that wether you need to "
              << "create a new directory. \n";
    bo = true;
  }
  if (Logger::warn_log_file_.is_open() == 0) {
    std::cout << "Cannot create file: " << warn_log_filename << ". "
              << "Please check that wether you need to "
              << "create a new directory. \n";
    bo = true;
  }
  if (Logger::erro_log_file_.is_open() == 0) {
    std::cout << "Cannot create file:  " << erro_log_filename << ". "
              << "Please check that wether you need to "
              << "create a new directory. \n";
    bo = true;
  }
  if (bo) { exit(0); }
}